

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TagImport::~TagImport(TagImport *this)

{
  TagImport *this_local;
  
  ~TagImport(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

explicit TagImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Tag>(), tag(name) {}